

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeGuardCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_d12213::CheckIncludeGuardIsSet(cmMakefile *mf,string *includeGuardVar)

{
  bool bVar1;
  cmState *pcVar2;
  cmStateSnapshot local_a0;
  cmValue local_88;
  undefined1 local_80 [8];
  cmStateDirectory stateDir;
  undefined1 local_40 [8];
  cmStateSnapshot dirSnapshot;
  string *includeGuardVar_local;
  cmMakefile *mf_local;
  
  dirSnapshot.Position.Position = (PositionType)cmMakefile::GetProperty(mf,includeGuardVar);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&dirSnapshot.Position.Position);
  if (bVar1) {
    mf_local._7_1_ = true;
  }
  else {
    cmMakefile::GetStateSnapshot((cmStateSnapshot *)&stateDir.Snapshot_.Position.Position,mf);
    cmStateSnapshot::GetBuildsystemDirectoryParent
              ((cmStateSnapshot *)local_40,(cmStateSnapshot *)&stateDir.Snapshot_.Position.Position)
    ;
    while (pcVar2 = cmStateSnapshot::GetState((cmStateSnapshot *)local_40), pcVar2 != (cmState *)0x0
          ) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_80,(cmStateSnapshot *)local_40);
      local_88 = cmStateDirectory::GetProperty((cmStateDirectory *)local_80,includeGuardVar);
      bVar1 = cmValue::operator_cast_to_bool(&local_88);
      if (bVar1) {
        return true;
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent(&local_a0,(cmStateSnapshot *)local_40);
    }
    mf_local._7_1_ = false;
  }
  return mf_local._7_1_;
}

Assistant:

bool CheckIncludeGuardIsSet(cmMakefile* mf, std::string const& includeGuardVar)
{
  if (mf->GetProperty(includeGuardVar)) {
    return true;
  }
  cmStateSnapshot dirSnapshot =
    mf->GetStateSnapshot().GetBuildsystemDirectoryParent();
  while (dirSnapshot.GetState()) {
    cmStateDirectory stateDir = dirSnapshot.GetDirectory();
    if (stateDir.GetProperty(includeGuardVar)) {
      return true;
    }
    dirSnapshot = dirSnapshot.GetBuildsystemDirectoryParent();
  }
  return false;
}